

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O2

void __thiscall ShellLinkHeader::parseShowCommand(ShellLinkHeader *this)

{
  uint uVar1;
  ostream *poVar2;
  
  uVar1 = (this->ShowCommand).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[3];
  if (uVar1 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SW_SHOWNORMAL");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The application is open and its window is open in a normal fashion.");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (this->ShowCommand).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SW_SHOWMAXIMIZED");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The application is open, and keyboard focus is given to the application, but its window is not shown."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = (this->ShowCommand).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[3];
  }
  if (uVar1 == 7) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SW_SHOWMINNOACTIVE");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The application is open, but its window is not shown. It is not given the keyboard focus."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

void ShellLinkHeader::parseShowCommand(){
        if (ShowCommand[3] == 1)
            cout << "SW_SHOWNORMAL" << endl << Utils::defaultOffsetDocInfo << "The application is open and its window is open in a normal fashion." << endl;
        if (ShowCommand[3] == 3)
            cout << "SW_SHOWMAXIMIZED" << endl << Utils::defaultOffsetDocInfo << "The application is open, and keyboard focus is given to the application, but its window is not shown." << endl;
        if (ShowCommand[3] == 7)
            cout << "SW_SHOWMINNOACTIVE" << endl << Utils::defaultOffsetDocInfo << "The application is open, but its window is not shown. It is not given the keyboard focus." << endl;
    }